

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileWhile(jx9_gen_state *pGen)

{
  sxu32 nLine;
  uint uVar1;
  GenBlock *pBlock;
  sxi32 sVar2;
  long lVar3;
  int iVar4;
  SyToken *pSVar5;
  SyToken *pSVar6;
  SyToken *pSVar7;
  GenBlock *pWhileBlock;
  sxu32 nFalseJump;
  GenBlock *local_40;
  sxu32 local_34 [3];
  
  local_40 = (GenBlock *)0x0;
  pSVar7 = pGen->pIn;
  nLine = pSVar7->nLine;
  pGen->pIn = pSVar7 + 1;
  if ((pGen->pEnd <= pSVar7 + 1) || ((pSVar7[1].nType & 0x200) == 0)) {
    sVar2 = jx9GenCompileError(pGen,1,nLine,"Expected \'(\' after \'while\' keyword");
    if (sVar2 == -10) {
      return -10;
    }
    pSVar7 = pGen->pIn;
    while( true ) {
      if (pGen->pEnd <= pSVar7) {
        return 0;
      }
      if ((pSVar7->nType & 0x40040) != 0) break;
      pGen->pIn = pSVar7 + 1;
      pSVar7 = pSVar7 + 1;
    }
    return 0;
  }
  pGen->pIn = pSVar7 + 2;
  sVar2 = GenStateEnterBlock(pGen,1,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&local_40);
  if (sVar2 != 0) {
    return -10;
  }
  pSVar7 = pGen->pIn;
  pSVar6 = pGen->pEnd;
  if (pSVar7 < pSVar6) {
    iVar4 = 1;
    lVar3 = 0;
    do {
      uVar1 = *(uint *)((long)&pSVar7->nType + lVar3);
      if ((uVar1 >> 9 & 1) == 0) {
        if ((uVar1 >> 10 & 1) != 0) {
          if (iVar4 < 2) {
            if (lVar3 == 0) goto LAB_0012611a;
            break;
          }
          iVar4 = iVar4 + -1;
        }
      }
      else {
        iVar4 = iVar4 + 1;
      }
      pSVar5 = (SyToken *)((long)&pSVar7[1].sData.zString + lVar3);
      lVar3 = lVar3 + 0x20;
    } while (pSVar5 < pSVar6);
    pSVar7 = (SyToken *)((long)&(pSVar7->sData).zString + lVar3);
    if (pSVar7 < pSVar6) goto LAB_0012613f;
  }
LAB_0012611a:
  sVar2 = jx9GenCompileError(pGen,1,nLine,"Expected expression after \'while\' keyword");
  if (sVar2 == -10) {
    return -10;
  }
  pSVar6 = pGen->pEnd;
LAB_0012613f:
  pGen->pEnd = pSVar7;
  sVar2 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  if (sVar2 == -10) {
    return -10;
  }
  pSVar5 = pGen->pIn;
  while (pSVar5 < pSVar7) {
    sVar2 = jx9GenCompileError(pGen,1,pSVar5->nLine,"Unexpected token \'%z\'");
    if (sVar2 == -10) {
      return -10;
    }
    pSVar5 = pGen->pIn + 1;
    pGen->pIn = pSVar5;
  }
  pGen->pIn = pSVar7 + 1;
  pGen->pEnd = pSVar6;
  jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,local_34);
  local_34[1] = 9;
  local_34[2] = local_34[0];
  SySetPut(&local_40->aJumpFix,local_34 + 1);
  sVar2 = jx9CompileBlock(pGen);
  if (sVar2 != -10) {
    jx9VmEmitInstr(pGen->pVm,8,0,local_40->nFirstInstr,(void *)0x0,(sxu32 *)0x0);
    GenStateFixJumps(local_40,-1,pGen->pVm->pByteContainer->nUsed);
    pBlock = pGen->pCurrent;
    if (pBlock != (GenBlock *)0x0) {
      pGen->pCurrent = pBlock->pParent;
      GenStateFreeBlock(pBlock);
    }
    return 0;
  }
  return -10;
}

Assistant:

static sxi32 jx9CompileWhile(jx9_gen_state *pGen)
{ 
	GenBlock *pWhileBlock = 0;
	SyToken *pTmp, *pEnd = 0;
	sxu32 nFalseJump;
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	/* Jump the 'while' keyword */
	pGen->pIn++;    
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_LPAREN) == 0 ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected '(' after 'while' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		goto Synchronize;
	}
	/* Jump the left parenthesis '(' */
	pGen->pIn++; 
	/* Create the loop block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_LOOP, jx9VmInstrLength(pGen->pVm), 0, &pWhileBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Delimit the condition */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pGen->pIn == pEnd || pEnd >= pGen->pEnd ){
		/* Empty expression */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Expected expression after 'while' keyword");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}
	/* Swap token streams */
	pTmp = pGen->pEnd;
	pGen->pEnd = pEnd;
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	if( rc == SXERR_ABORT ){
		/* Expression handler request an operation abort [i.e: Out-of-memory] */
		return SXERR_ABORT;
	}
	/* Update token stream */
	while(pGen->pIn < pEnd ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	/* Synchronize pointers */
	pGen->pIn  = &pEnd[1];
	pGen->pEnd = pTmp;
	/* Emit the false jump */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nFalseJump);
	/* Save the instruction index so we can fix it later when the jump destination is resolved */
	GenStateNewJumpFixup(pWhileBlock, JX9_OP_JZ, nFalseJump);
	/* Compile the loop body */
	rc = jx9CompileBlock(&(*pGen));
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Emit the unconditional jump to the start of the loop */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pWhileBlock->nFirstInstr, 0, 0);
	/* Fix all jumps now the destination is resolved */
	GenStateFixJumps(pWhileBlock, -1, jx9VmInstrLength(pGen->pVm));
	/* Release the loop block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid 
	 * compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}